

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTest.hpp
# Opt level: O3

void __thiscall
Qentem::QTest::IsNotEqual<Qentem::String<char>,char[3]>
          (QTest *this,String<char> *left,char (*right) [3],unsigned_long line)

{
  ulong uVar1;
  char cVar2;
  
  if ((this->error_ != true) || (this->continue_on_error_ == true)) {
    cVar2 = (*right)[0];
    if (cVar2 == '\0') {
      uVar1 = 0;
    }
    else {
      uVar1 = 0;
      do {
        if (cVar2 != left->storage_[uVar1 & 0xffffffff]) {
          return;
        }
        cVar2 = (*right)[uVar1 + 1];
        uVar1 = uVar1 + 1;
      } while (cVar2 != '\0');
    }
    if (left->length_ == (SizeT)uVar1) {
      this->error_ = true;
      PrintErrorMessage<Qentem::String<char>,char[3]>(this,true,left,right,line);
      return;
    }
  }
  return;
}

Assistant:

QENTEM_NOINLINE void IsNotEqual(const Value1_T &left, const Value2_T &right, unsigned long line) {
        if ((!error_ || continue_on_error_) && (left == right)) {
            error_ = true;
            QTest::PrintErrorMessage(true, left, right, line);
        }
    }